

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PromoteSegments(Fts3Table *p,sqlite3_int64 iAbsLevel,sqlite3_int64 nByte)

{
  sqlite3_stmt *psVar1;
  int iVar2;
  int iVar3;
  sqlite3_stmt *local_70;
  sqlite3_stmt *pUpdate2;
  sqlite3_stmt *pUpdate1;
  int iIdx;
  i64 dummy;
  i64 nSize;
  i64 nLimit;
  i64 iLast;
  sqlite3_stmt *psStack_30;
  int bOk;
  sqlite3_stmt *pRange;
  sqlite3_int64 sStack_20;
  int rc;
  sqlite3_int64 nByte_local;
  sqlite3_int64 iAbsLevel_local;
  Fts3Table *p_local;
  
  pRange._4_4_ = 0;
  sStack_20 = nByte;
  nByte_local = iAbsLevel;
  iAbsLevel_local = (sqlite3_int64)p;
  pRange._4_4_ = fts3SqlStmt(p,0x25,&stack0xffffffffffffffd0,(sqlite3_value **)0x0);
  if (pRange._4_4_ == 0) {
    iLast._4_4_ = 0;
    nLimit = (nByte_local / 0x400 + 1) * 0x400 + -1;
    nSize = (sStack_20 * 3) / 2;
    sqlite3_bind_int64(psStack_30,1,nByte_local + 1);
    sqlite3_bind_int64(psStack_30,2,nLimit);
    while (iVar2 = sqlite3_step(psStack_30), iVar2 == 100) {
      dummy = 0;
      fts3ReadEndBlockField(psStack_30,2,(i64 *)&stack0xffffffffffffffa8,&dummy);
      if ((dummy < 1) || (nSize < dummy)) {
        iLast._4_4_ = 0;
        break;
      }
      iLast._4_4_ = 1;
    }
    pRange._4_4_ = sqlite3_reset(psStack_30);
    if (iLast._4_4_ != 0) {
      pUpdate1._4_4_ = 0;
      pUpdate2 = (sqlite3_stmt *)0x0;
      local_70 = (sqlite3_stmt *)0x0;
      if (pRange._4_4_ == 0) {
        pRange._4_4_ = fts3SqlStmt((Fts3Table *)iAbsLevel_local,0x26,&pUpdate2,(sqlite3_value **)0x0
                                  );
      }
      if (pRange._4_4_ == 0) {
        pRange._4_4_ = fts3SqlStmt((Fts3Table *)iAbsLevel_local,0x27,&local_70,(sqlite3_value **)0x0
                                  );
      }
      if (pRange._4_4_ == 0) {
        sqlite3_bind_int64(psStack_30,1,nByte_local);
        do {
          iVar3 = sqlite3_step(psStack_30);
          iVar2 = pUpdate1._4_4_;
          if (iVar3 != 100) goto LAB_00205d84;
          pUpdate1._4_4_ = pUpdate1._4_4_ + 1;
          sqlite3_bind_int(pUpdate2,1,iVar2);
          psVar1 = pUpdate2;
          iVar2 = sqlite3_column_int(psStack_30,0);
          sqlite3_bind_int(psVar1,2,iVar2);
          psVar1 = pUpdate2;
          iVar2 = sqlite3_column_int(psStack_30,1);
          sqlite3_bind_int(psVar1,3,iVar2);
          sqlite3_step(pUpdate2);
          pRange._4_4_ = sqlite3_reset(pUpdate2);
        } while (pRange._4_4_ == 0);
        sqlite3_reset(psStack_30);
      }
LAB_00205d84:
      if (pRange._4_4_ == 0) {
        pRange._4_4_ = sqlite3_reset(psStack_30);
      }
      if (pRange._4_4_ == 0) {
        sqlite3_bind_int64(local_70,1,nByte_local);
        sqlite3_step(local_70);
        pRange._4_4_ = sqlite3_reset(local_70);
      }
    }
  }
  return pRange._4_4_;
}

Assistant:

static int fts3PromoteSegments(
  Fts3Table *p,                   /* FTS table handle */
  sqlite3_int64 iAbsLevel,        /* Absolute level just updated */
  sqlite3_int64 nByte             /* Size of new segment at iAbsLevel */
){
  int rc = SQLITE_OK;
  sqlite3_stmt *pRange;

  rc = fts3SqlStmt(p, SQL_SELECT_LEVEL_RANGE2, &pRange, 0);

  if( rc==SQLITE_OK ){
    int bOk = 0;
    i64 iLast = (iAbsLevel/FTS3_SEGDIR_MAXLEVEL + 1) * FTS3_SEGDIR_MAXLEVEL - 1;
    i64 nLimit = (nByte*3)/2;

    /* Loop through all entries in the %_segdir table corresponding to 
    ** segments in this index on levels greater than iAbsLevel. If there is
    ** at least one such segment, and it is possible to determine that all 
    ** such segments are smaller than nLimit bytes in size, they will be 
    ** promoted to level iAbsLevel.  */
    sqlite3_bind_int64(pRange, 1, iAbsLevel+1);
    sqlite3_bind_int64(pRange, 2, iLast);
    while( SQLITE_ROW==sqlite3_step(pRange) ){
      i64 nSize = 0, dummy;
      fts3ReadEndBlockField(pRange, 2, &dummy, &nSize);
      if( nSize<=0 || nSize>nLimit ){
        /* If nSize==0, then the %_segdir.end_block field does not not 
        ** contain a size value. This happens if it was written by an
        ** old version of FTS. In this case it is not possible to determine
        ** the size of the segment, and so segment promotion does not
        ** take place.  */
        bOk = 0;
        break;
      }
      bOk = 1;
    }
    rc = sqlite3_reset(pRange);

    if( bOk ){
      int iIdx = 0;
      sqlite3_stmt *pUpdate1 = 0;
      sqlite3_stmt *pUpdate2 = 0;

      if( rc==SQLITE_OK ){
        rc = fts3SqlStmt(p, SQL_UPDATE_LEVEL_IDX, &pUpdate1, 0);
      }
      if( rc==SQLITE_OK ){
        rc = fts3SqlStmt(p, SQL_UPDATE_LEVEL, &pUpdate2, 0);
      }

      if( rc==SQLITE_OK ){

        /* Loop through all %_segdir entries for segments in this index with
        ** levels equal to or greater than iAbsLevel. As each entry is visited,
        ** updated it to set (level = -1) and (idx = N), where N is 0 for the
        ** oldest segment in the range, 1 for the next oldest, and so on.
        **
        ** In other words, move all segments being promoted to level -1,
        ** setting the "idx" fields as appropriate to keep them in the same
        ** order. The contents of level -1 (which is never used, except
        ** transiently here), will be moved back to level iAbsLevel below.  */
        sqlite3_bind_int64(pRange, 1, iAbsLevel);
        while( SQLITE_ROW==sqlite3_step(pRange) ){
          sqlite3_bind_int(pUpdate1, 1, iIdx++);
          sqlite3_bind_int(pUpdate1, 2, sqlite3_column_int(pRange, 0));
          sqlite3_bind_int(pUpdate1, 3, sqlite3_column_int(pRange, 1));
          sqlite3_step(pUpdate1);
          rc = sqlite3_reset(pUpdate1);
          if( rc!=SQLITE_OK ){
            sqlite3_reset(pRange);
            break;
          }
        }
      }
      if( rc==SQLITE_OK ){
        rc = sqlite3_reset(pRange);
      }

      /* Move level -1 to level iAbsLevel */
      if( rc==SQLITE_OK ){
        sqlite3_bind_int64(pUpdate2, 1, iAbsLevel);
        sqlite3_step(pUpdate2);
        rc = sqlite3_reset(pUpdate2);
      }
    }
  }


  return rc;
}